

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example0.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  char *pcVar5;
  double dVar6;
  byte local_16d2;
  byte local_16c2;
  byte local_16b2;
  byte local_16a2;
  byte local_1692;
  byte local_1682;
  byte local_1672;
  byte local_1662;
  byte local_1652;
  byte local_162a;
  byte local_161a;
  byte local_160a;
  byte local_15fa;
  byte local_157a;
  byte local_156a;
  byte local_155a;
  allocator<char> local_14d1;
  string local_14d0;
  double local_14b0;
  double local_14a8;
  double local_14a0;
  Vector3T<double,_false> local_1498;
  allocator<char> local_1479;
  string local_1478;
  double local_1458;
  double local_1450;
  double local_1448;
  Vector3T<double,_false> local_1440;
  allocator<char> local_1421;
  string local_1420;
  double local_1400;
  allocator<char> local_13f1;
  string local_13f0;
  double local_13d0;
  double local_13c8;
  double local_13c0;
  Vector3T<double,_false> local_13b8;
  allocator<char> local_1399;
  string local_1398;
  double local_1378;
  double local_1370;
  double local_1368;
  Vector3T<double,_false> local_1360;
  allocator<char> local_1341;
  string local_1340;
  double local_1320;
  allocator<char> local_1311;
  string local_1310;
  double local_12f0;
  double local_12e8;
  double local_12e0;
  Vector3T<double,_false> local_12d8;
  allocator<char> local_12b9;
  string local_12b8;
  double local_1298;
  double local_1290;
  double local_1288;
  Vector3T<double,_false> local_1280;
  allocator<char> local_1261;
  string local_1260;
  double local_1240;
  undefined1 local_1238 [8];
  Point3 p6;
  Point3 p5;
  Point3 p4;
  Point3 p3;
  CD_Pair pair3;
  CD_Pair local_dc8 [8];
  CD_Pair pair2;
  double local_9b0;
  double local_9a8 [4];
  S_Superellipsoid local_988 [8];
  S_Superellipsoid super;
  allocator<char> local_8a9;
  string local_8a8;
  double local_888;
  double local_880;
  double local_878;
  Vector3T<double,_false> local_870;
  allocator<char> local_851;
  string local_850;
  double local_830;
  double local_828;
  double local_820;
  Vector3T<double,_false> local_818;
  allocator<char> local_7f9;
  string local_7f8;
  double local_7d8;
  allocator<char> local_7c9;
  string local_7c8;
  double local_7a8;
  double local_7a0;
  Scalar d2;
  Scalar d1;
  double local_788;
  double local_780 [4];
  allocator<char> local_759;
  string local_758;
  double local_738;
  double local_730;
  double local_728;
  Vector3T<double,_false> local_720;
  allocator<char> local_701;
  string local_700;
  double local_6e0;
  double local_6d8;
  double local_6d0;
  Vector3T<double,_false> local_6c8;
  allocator<char> local_6a9;
  string local_6a8;
  double local_688;
  byte local_679;
  undefined1 local_678 [7];
  bool comparison;
  Point3 p2;
  Point3 p1;
  Scalar d0;
  Scalar collision;
  CD_Pair pair1;
  undefined8 local_228;
  double local_220;
  Vector3T<double,_false> local_218;
  double local_200;
  double local_1f8;
  double local_1f0;
  undefined1 auStack_1e8 [8];
  Vector3 vrot;
  double local_1c8;
  double local_1c0 [5];
  S_Sphere local_198 [8];
  S_Sphere sphere;
  double local_f8;
  double local_f0 [3];
  undefined8 local_d8;
  double local_d0;
  double local_c8;
  S_Box local_c0 [8];
  S_Box box;
  char **param_1_local;
  int param_0_local;
  
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xf);
  std::ios_base::precision((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),0xf);
  sch::S_Box::S_Box(local_c0,0.2,0.1,0.4);
  local_c8 = 0.1;
  local_d0 = 0.7;
  local_d8 = 0x3feccccccccccccd;
  sch::S_Object::setPosition((double *)local_c0,&local_c8,&local_d0);
  local_f0[0] = 0.1;
  local_f8 = 1.0;
  sch::S_Object::setOrientation((double *)local_c0,local_f0,&local_f8);
  local_1c0[4] = 0.3;
  sch::S_Sphere::S_Sphere(local_198,local_1c0 + 4);
  local_1c0[3] = 0.5;
  local_1c0[2] = 0.8;
  local_1c0[1] = 1.1;
  sch::S_Object::addScale((double *)local_198,local_1c0 + 3,local_1c0 + 2);
  local_1c0[0] = 0.1;
  local_1c8 = -0.7;
  vrot.m_z = -0.9;
  sch::S_Object::setPosition((double *)local_198,local_1c0,&local_1c8);
  local_1f0 = 0.2;
  local_1f8 = 0.4;
  local_200 = 0.5;
  CD_Matrix::Vector3T<double,_false>::Vector3T
            ((Vector3T<double,_false> *)auStack_1e8,&local_1f0,&local_1f8,&local_200);
  local_220 = CD_Matrix::Vector3T<double,_false>::norm((Vector3T<double,_false> *)auStack_1e8);
  CD_Matrix::Vector3T<double,_false>::operator/
            (&local_218,(Vector3T<double,_false> *)auStack_1e8,&local_220);
  vrot.m_y = local_218.m_z;
  auStack_1e8 = (undefined1  [8])local_218.m_x;
  vrot.m_x = local_218.m_y;
  local_228 = 0x3fe999999999999a;
  sch::S_Object::addRotation((double *)local_198,(Vector3T *)&local_228);
  sch::CD_Pair::CD_Pair((CD_Pair *)&collision,(S_Object *)local_c0,(S_Object *)local_198);
  bVar1 = sch::CD_Pair::isInCollision();
  dVar6 = (double)sch::CD_Pair::getDistance();
  p1.m_z = sqrt(ABS(dVar6));
  CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&p2.m_z);
  CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)local_678);
  sch::CD_Pair::getClosestPoints((Vector3T *)&collision,(Vector3T *)&p2.m_z);
  poVar3 = std::operator<<((ostream *)&std::cout,"First Query");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Collision: ");
  pcVar5 = "False";
  if ((double)(bVar1 & 1) != 0.0) {
    pcVar5 = "True";
  }
  if (NAN((double)(bVar1 & 1))) {
    pcVar5 = "True";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Distance: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,p1.m_z);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Witness points: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)&p2.m_z);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)local_678);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_679 = 1;
  local_688 = 1.75797057738;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"First query, d0. ",&local_6a9);
  bVar2 = compare<double>(&p1.m_z,&local_688,&local_6a8,1e-12);
  local_155a = 0;
  if (bVar2) {
    local_155a = local_679;
  }
  local_679 = local_155a & 1;
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  local_6d0 = 0.0292236259886;
  local_6d8 = 0.601445137096;
  local_6e0 = 0.705635281289;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_6c8,&local_6d0,&local_6d8,&local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_700,"First query, p1. ",&local_701);
  bVar2 = compare((Vector3 *)&p2.m_z,&local_6c8,&local_700,1e-12);
  local_156a = 0;
  if (bVar2) {
    local_156a = local_679;
  }
  local_679 = local_156a & 1;
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  local_728 = 0.0239874216807;
  local_730 = -0.336387177086;
  local_738 = -0.781275504057;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_720,&local_728,&local_730,&local_738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"First query, p2. ",&local_759);
  bVar2 = compare((Vector3 *)local_678,&local_720,&local_758,1e-12);
  local_157a = 0;
  if (bVar2) {
    local_157a = local_679;
  }
  local_679 = local_157a & 1;
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  local_780[3] = 0.0;
  local_780[2] = 0.0;
  local_780[1] = 0.0;
  sch::S_Object::setPosition((double *)local_c0,local_780 + 3,local_780 + 2);
  local_780[0] = 0.01;
  local_788 = 0.0;
  d1 = 0.0;
  sch::S_Object::setPosition((double *)local_198,local_780,&local_788);
  bVar1 = sch::CD_Pair::isInCollision();
  dVar6 = (double)sch::CD_Pair::getDistanceWithoutPenetrationDepth();
  d2 = sqrt(ABS(dVar6));
  dVar6 = (double)sch::CD_Pair::getDistance();
  local_7a0 = sqrt(ABS(dVar6));
  sch::CD_Pair::getClosestPoints((Vector3T *)&collision,(Vector3T *)&p2.m_z);
  poVar3 = std::operator<<((ostream *)&std::cout,"Second Query");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Collision: ");
  pcVar5 = "False";
  if ((double)(bVar1 & 1) != 0.0) {
    pcVar5 = "True";
  }
  if (NAN((double)(bVar1 & 1))) {
    pcVar5 = "True";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Distance: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,d2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Depth: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_7a0);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Witness points: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)&p2.m_z);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)local_678);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_7a8 = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"Second query, d1. ",&local_7c9);
  bVar2 = compare<double>(&d2,&local_7a8,&local_7c8,1e-12);
  local_15fa = 0;
  if (bVar2) {
    local_15fa = local_679;
  }
  local_679 = local_15fa & 1;
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  local_7d8 = 0.293744618861213;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"Second query, d2. ",&local_7f9);
  bVar2 = compare<double>(&local_7a0,&local_7d8,&local_7f8,1e-12);
  local_160a = 0;
  if (bVar2) {
    local_160a = local_679;
  }
  local_679 = local_160a & 1;
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  local_820 = 0.0110146674327551;
  local_828 = -0.0498945075944604;
  local_830 = -0.0551780527427314;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_818,&local_820,&local_828,&local_830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"Second query, p1. ",&local_851);
  bVar2 = compare((Vector3 *)&p2.m_z,&local_818,&local_850,1e-12);
  local_161a = 0;
  if (bVar2) {
    local_161a = local_679;
  }
  local_679 = local_161a & 1;
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  local_878 = -0.158401731667896;
  local_880 = 0.18954845401356;
  local_888 = -0.0393334018450828;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_870,&local_878,&local_880,&local_888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"Second query, p2. ",&local_8a9);
  bVar2 = compare((Vector3 *)local_678,&local_870,&local_8a8,1e-12);
  local_162a = 0;
  if (bVar2) {
    local_162a = local_679;
  }
  local_679 = local_162a & 1;
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  sch::S_Superellipsoid::S_Superellipsoid(local_988,0.1,0.9,0.3,0.5,0.8);
  local_9a8[3] = 0.2;
  local_9a8[2] = 0.8;
  local_9a8[1] = 1.0;
  sch::S_Object::setPosition((double *)local_988,local_9a8 + 3,local_9a8 + 2);
  local_9a8[0] = 0.2;
  local_9b0 = 1.7;
  sch::S_Object::setOrientation((double *)local_988,local_9a8,&local_9b0);
  sch::CD_Pair::CD_Pair(local_dc8,(S_Object *)local_c0,(S_Object *)local_988);
  sch::CD_Pair::CD_Pair((CD_Pair *)&p3.m_z,(S_Object *)local_198,(S_Object *)local_988);
  CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&p4.m_z);
  CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&p5.m_z);
  CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&p6.m_z);
  CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)local_1238);
  p1.m_z = (double)sch::CD_Pair::getClosestPoints((Vector3T *)&collision,(Vector3T *)&p2.m_z);
  d2 = (Scalar)sch::CD_Pair::getClosestPoints((Vector3T *)local_dc8,(Vector3T *)&p4.m_z);
  local_7a0 = (double)sch::CD_Pair::getClosestPoints((Vector3T *)&p3.m_z,(Vector3T *)&p6.m_z);
  local_1240 = -0.0862859011099191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1260,"Third Query, d0",&local_1261);
  bVar2 = compare<double>(&p1.m_z,&local_1240,&local_1260,1e-12);
  local_1652 = 0;
  if (bVar2) {
    local_1652 = local_679;
  }
  local_679 = local_1652 & 1;
  std::__cxx11::string::~string((string *)&local_1260);
  std::allocator<char>::~allocator(&local_1261);
  local_1288 = 0.0110146674327551;
  local_1290 = -0.0498945075944604;
  local_1298 = -0.0551780527427314;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_1280,&local_1288,&local_1290,&local_1298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12b8,"Third Query, p1",&local_12b9);
  bVar2 = compare((Vector3 *)&p2.m_z,&local_1280,&local_12b8,1e-12);
  local_1662 = 0;
  if (bVar2) {
    local_1662 = local_679;
  }
  local_679 = local_1662 & 1;
  std::__cxx11::string::~string((string *)&local_12b8);
  std::allocator<char>::~allocator(&local_12b9);
  local_12e0 = -0.158401731667896;
  local_12e8 = 0.18954845401356;
  local_12f0 = -0.0393334018450828;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_12d8,&local_12e0,&local_12e8,&local_12f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1310,"Third Query, p2",&local_1311);
  bVar2 = compare((Vector3 *)local_678,&local_12d8,&local_1310,1e-12);
  local_1672 = 0;
  if (bVar2) {
    local_1672 = local_679;
  }
  local_679 = local_1672 & 1;
  std::__cxx11::string::~string((string *)&local_1310);
  std::allocator<char>::~allocator(&local_1311);
  local_1320 = 0.659596933491;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1340,"Third Query, d1",&local_1341);
  bVar2 = compare<double>(&d2,&local_1320,&local_1340,1e-12);
  local_1682 = 0;
  if (bVar2) {
    local_1682 = local_679;
  }
  local_679 = local_1682 & 1;
  std::__cxx11::string::~string((string *)&local_1340);
  std::allocator<char>::~allocator(&local_1341);
  local_1368 = 0.0707763740114;
  local_1370 = 0.0985548629043;
  local_1378 = 0.194364718711;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_1360,&local_1368,&local_1370,&local_1378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1398,"Third Query, p3",&local_1399);
  bVar2 = compare((Vector3 *)&p4.m_z,&local_1360,&local_1398,1e-12);
  local_1692 = 0;
  if (bVar2) {
    local_1692 = local_679;
  }
  local_679 = local_1692 & 1;
  std::__cxx11::string::~string((string *)&local_1398);
  std::allocator<char>::~allocator(&local_1399);
  local_13c0 = 0.259412979986;
  local_13c8 = 0.301096580075;
  local_13d0 = 0.95790254828;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_13b8,&local_13c0,&local_13c8,&local_13d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13f0,"Third Query, p4",&local_13f1);
  bVar2 = compare((Vector3 *)&p5.m_z,&local_13b8,&local_13f0,1e-12);
  local_16a2 = 0;
  if (bVar2) {
    local_16a2 = local_679;
  }
  local_679 = local_16a2 & 1;
  std::__cxx11::string::~string((string *)&local_13f0);
  std::allocator<char>::~allocator(&local_13f1);
  local_1400 = 0.516365498703901;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1420,"Third Query, d2",&local_1421);
  bVar2 = compare<double>(&local_7a0,&local_1400,&local_1420,1e-12);
  local_16b2 = 0;
  if (bVar2) {
    local_16b2 = local_679;
  }
  local_679 = local_16b2 & 1;
  std::__cxx11::string::~string((string *)&local_1420);
  std::allocator<char>::~allocator(&local_1421);
  local_1448 = 0.126586144900461;
  local_1450 = 0.0390218116062935;
  local_1458 = 0.297048794226006;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_1440,&local_1448,&local_1450,&local_1458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1478,"Third Query, p5",&local_1479);
  bVar2 = compare((Vector3 *)&p6.m_z,&local_1440,&local_1478,1e-12);
  local_16c2 = 0;
  if (bVar2) {
    local_16c2 = local_679;
  }
  local_679 = local_16c2 & 1;
  std::__cxx11::string::~string((string *)&local_1478);
  std::allocator<char>::~allocator(&local_1479);
  local_14a0 = 0.300323477842992;
  local_14a8 = 0.23919818987692;
  local_14b0 = 0.964963650647371;
  CD_Matrix::Vector3T<double,_false>::Vector3T(&local_1498,&local_14a0,&local_14a8,&local_14b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14d0,"Third Query, p6",&local_14d1);
  bVar2 = compare((Vector3 *)local_1238,&local_1498,&local_14d0,1e-12);
  local_16d2 = 0;
  if (bVar2) {
    local_16d2 = local_679;
  }
  local_679 = local_16d2 & 1;
  std::__cxx11::string::~string((string *)&local_14d0);
  std::allocator<char>::~allocator(&local_14d1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Third Query");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Distance1 Squared: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,p1.m_z);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Witness points 1: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)&p2.m_z);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)local_678);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Distance2 Squared: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,d2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Witness points 2: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)&p4.m_z);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)&p5.m_z);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Distance3 Squared: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_7a0);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Witness points 3: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)&p6.m_z);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar3 = CD_Matrix::operator<<(poVar3,(Vector3T<double,_false> *)local_1238);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  bVar1 = local_679 & 1;
  sch::CD_Pair::~CD_Pair((CD_Pair *)&p3.m_z);
  sch::CD_Pair::~CD_Pair(local_dc8);
  sch::S_Superellipsoid::~S_Superellipsoid(local_988);
  sch::CD_Pair::~CD_Pair((CD_Pair *)&collision);
  sch::S_Sphere::~S_Sphere(local_198);
  sch::S_Box::~S_Box(local_c0);
  return (uint)(bVar1 == 0);
}

Assistant:

int main(int /*argc*/, char * /*argv*/[])
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif

  // Set output precision
  std::cout.precision(std::numeric_limits<double>::digits10);
  std::cerr.precision(std::numeric_limits<double>::digits10);

  //***********
  // Object initializations

  // A box with height, width and depth
  S_Box box(0.2, 0.1, 0.4);

  // Set the position in the world reference frame
  box.setPosition(0.1, 0.7, 0.9);

  // Set the orientation of the Object
  //(many different orientations representations are supported, here Roll
  //  pitch yaw)
  box.setOrientation(0.1, 1, 0.7);

  // A second object, a sphere with a radius
  S_Sphere sphere(0.3);

  // let's transform it into an ellipsoid
  // we add an anisotropic scale to the sphere
  //  (the scale has to be the first operation as it affects also
  //  rotations and translations)
  sphere.addScale(0.5, 0.8, 1.1);

  // Set the position in the world reference frame
  sphere.setPosition(0.1, -0.7, -0.9);

  // We turn it around the axis vrot defined by
  Vector3 vrot(0.2, 0.4, 0.5);
  vrot = vrot / vrot.norm();

  // let's turn it by 0.8 rad (we use addRotation instead of setRotation
  //  to not loose the scale)
  sphere.addRotation(0.8, vrot);

  //********
  // Proximity queries

  // Create a proximity-query pair of objects. It takes the addresses of the
  // objects. The user is responsible of guaranteeing the existance of the
  // objects at these addresses during all the period of use of the pair and
  // desrtoying the objects at the end.
  // Note that STL containers (vectors, deque, etc.) do not guarantee that
  // objects remain at same address. Use them with care.
  CD_Pair pair1(&box, &sphere);

  // Are they in collision ?
  // This is the fastest proximity query as it runs GJK with the lowest
  //  precision
  Scalar collision = pair1.isInCollision();

  // This runs GJK with 1e-6 precision.
  //  WARNING : THE PROVIDED DISTANCE IS SQUARED for computation time
  //  purpose, the real distance is then obtained by square root
  //  this algorithm takes profit from the warm start provided by the
  //  previous query, so there is virtually no additional cost at making
  //  these two requests instead of directly the last one.
  //  if there is a collision, this will compute the penetration depth
  Scalar d0 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  Point3 p1, p2;
  // get the Witness points without running GJK or depth computation again
  //  (it detects that the object did not move since the last query, if
  //  one or both moved, this query would trigger GJK algorithm).
  //  this method returns the distance also.
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "First Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d0 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for first query
  bool comparison = true;
  comparison = compare(d0, 1.75797057738, "First query, d0. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0292236259886, 0.601445137096, 0.705635281289)), "First query, p1. ") && comparison;
  comparison =
      compare(p2, (Vector3(0.0239874216807, -0.336387177086, -0.781275504057)), "First query, p2. ") && comparison;

  // Now we move the objects to enter in collision
  // We avoid symmetries to always get the same witness points.
  box.setPosition(0, 0, 0);
  sphere.setPosition(0.01, 0, 0);

  // Query again
  collision = pair1.isInCollision();

  // Let's run again the Distance computation, but not the penetration
  // depth, because the last algorithm is much slower, if there is a
  // collision, the output would be zero
  //
  Scalar d1 = sqrt(fabs(pair1.getDistanceWithoutPenetrationDepth()));

  // We call now the regular distance query (collision will trigger
  // depth query and the distance will be given in negative to distinguish
  //  it from separating distance)
  Scalar d2 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "Second Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d1 << std::endl;
  std::cout << "Depth: " << d2 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for second query
  comparison = compare(d1, 0., "Second query, d1. ") && comparison;
#ifdef SCH_BUILD_BSD
  comparison = compare(d2, 0., "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Second query, p2. ")
               && comparison;
#else
  comparison = compare(d2, 0.293744618861213, "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Second query, p2. ")
               && comparison;
#endif

  //******************
  // More objects

  // Create the third object
  //  A superellipsoid with height, width, depth, epsilon1, epsilon2
  S_Superellipsoid super(0.1, 0.9, 0.3, 0.5, 0.8);

  // Position/Orientation
  super.setPosition(0.2, 0.8, 1);
  super.setOrientation(0.2, 1.7, 0.8);

  // Creation of new pairs related to the new objects. Each pair of 3D objects
  // is then a C++ objects
  CD_Pair pair2(&box, &super);
  CD_Pair pair3(&sphere, &super);

  // Our witness points
  Point3 p3, p4, p5, p6;

  // We can directly ask for the closest points
  // When the returned value is negative, it is the opposite of the squared
  // depth.
  d0 = pair1.getClosestPoints(p1, p2);
  d1 = pair2.getClosestPoints(p3, p4);
  d2 = pair3.getClosestPoints(p5, p6);

  // compare the results for third query
#ifdef SCH_BUILD_BSD
  comparison = compare(d0, 0., "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Third Query, p1")
               && comparison;
  comparison =
      compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Third Query, p2") && comparison;
#else
  comparison = compare(d0, -0.0862859011099191, "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Third Query, p1")
               && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Third Query, p2")
               && comparison;
#endif

  comparison = compare(d1, 0.659596933491, "Third Query, d1") && comparison;
  comparison =
      compare(p3, (Vector3(0.0707763740114, 0.0985548629043, 0.194364718711)), "Third Query, p3") && comparison;
  comparison = compare(p4, (Vector3(0.259412979986, 0.301096580075, 0.95790254828)), "Third Query, p4") && comparison;

  comparison = compare(d2, 0.516365498703901, "Third Query, d2") && comparison;
  comparison = compare(p5, (sch::Vector3(0.126586144900461, 0.0390218116062935, 0.297048794226006)), "Third Query, p5")
               && comparison;
  comparison = compare(p6, (sch::Vector3(0.300323477842992, 0.23919818987692, 0.964963650647371)), "Third Query, p6")
               && comparison;

  // Let's display all this stuff
  std::cout << "Third Query" << std::endl;
  std::cout << "Distance1 Squared: " << d0 << std::endl;
  std::cout << "Witness points 1: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << "Distance2 Squared: " << d1 << std::endl;
  std::cout << "Witness points 2: " << std::endl;
  std::cout << "P1: " << p3 << std::endl;
  std::cout << "P2: " << p4 << std::endl;
  std::cout << "Distance3 Squared: " << d2 << std::endl;
  std::cout << "Witness points 3: " << std::endl;
  std::cout << "P1: " << p5 << std::endl;
  std::cout << "P2: " << p6 << std::endl;
  std::cout << std::endl;

  return (comparison ? 0 : 1);
  // That's all folks
}